

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O2

int __thiscall Fl_Menu_::find_index(Fl_Menu_ *this,Fl_Callback *cb)

{
  int iVar1;
  int t;
  long lVar2;
  long lVar3;
  
  lVar3 = 0x10;
  lVar2 = 0;
  while( true ) {
    iVar1 = size(this);
    if (iVar1 <= lVar2) {
      return -1;
    }
    if (*(Fl_Callback **)((long)&this->menu_->text + lVar3) == cb) break;
    lVar2 = lVar2 + 1;
    lVar3 = lVar3 + 0x38;
  }
  return (int)lVar2;
}

Assistant:

int Fl_Menu_::find_index(Fl_Callback *cb) const {
  for ( int t=0; t < size(); t++ )
    if (menu_[t].callback_==cb)
      return(t);
  return(-1);
}